

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O1

void sf::priv::CloseDisplay(Display *display)

{
  Lock lock;
  Lock local_10;
  
  Lock::Lock(&local_10,(Mutex *)&(anonymous_namespace)::mutex);
  if ((anonymous_namespace)::sharedDisplay == display) {
    (anonymous_namespace)::referenceCount = (anonymous_namespace)::referenceCount + -1;
    if ((anonymous_namespace)::referenceCount == 0) {
      XCloseDisplay(display);
    }
    Lock::~Lock(&local_10);
    return;
  }
  __assert_fail("display == sharedDisplay",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Window/Unix/Display.cpp"
                ,0x51,"void sf::priv::CloseDisplay(Display *)");
}

Assistant:

void CloseDisplay(Display* display)
{
    Lock lock(mutex);

    assert(display == sharedDisplay);

    referenceCount--;
    if (referenceCount == 0)
        XCloseDisplay(display);
}